

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest_TestDecodingFullPriceUpdate_Test::
~PriceSyncDecoderTest_TestDecodingFullPriceUpdate_Test
          (PriceSyncDecoderTest_TestDecodingFullPriceUpdate_Test *this)

{
  PriceSyncDecoderTest::~PriceSyncDecoderTest(&this->super_PriceSyncDecoderTest);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_F(PriceSyncDecoderTest, TestDecodingFullPriceUpdate)
{
    ByteBuffer buffer = BufferUtil::HexBuffer("500007b6b0b1e4f12c2f0401" // 'P' - 0 - 7 - 1542372218934 - 47 - 4 - 1
                                                               "66" // 'f' - type
                                                               "08" // 8 - SID
                                                               "04" // 4 - field count
                                                                   "00" // 0 - FID (Bid)
                                                                   "4011c5a1cac08312" // 4.443
                                                                   "01" // 1 - FID (BidSize)
                                                                   "000000000000157c" // 5500
                                                                   "02" // 2 - FID (Ask)
                                                                   "401d607dd4413554" // 7.34423
                                                                   "03" // 3 - FID (AskSize)
                                                                   "0000000000001db0" // 7600
                                                                   );
    EXPECT_EQ('P', buffer.ReadByte());
    PriceSync price_sync = decoder.DecodePriceSync(buffer);
    EXPECT_EQ(7, price_sync.GetRevision());
    EXPECT_EQ(1542372218934, price_sync.GetRevisionTime());
    EXPECT_EQ(47, price_sync.GetConflationLatency());
    EXPECT_EQ(4, price_sync.GetEdition());
    EXPECT_EQ(1, price_sync.GetSize());
    EXPECT_FALSE(price_sync.IsCompressed());

    std::deque<std::shared_ptr<PriceEvent>> events;
    auto syncable = QueueingPriceSyncListener(&events);
    price_sync.Visit(data_dictionary, syncable);

    ASSERT_FALSE(events.empty());

    std::shared_ptr<PriceEvent> event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected1;
    expected1.emplace("Ask", PriceField(7.34423));
    expected1.emplace("AskSize", PriceField(7600));
    expected1.emplace("Bid", PriceField(4.443));
    expected1.emplace("BidSize", PriceField(5500));
    EXPECT_EQ(8, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected1, *event);

    EXPECT_TRUE(events.empty());
}